

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

uchar sensors_analytics::utils::DecimalFromHex(uchar x)

{
  byte bVar1;
  
  if ((byte)(x + 0xbf) < 0x1a) {
    return x + 0xc9;
  }
  if ((byte)(x + 0x9f) < 0x1a) {
    return x + 0xa9;
  }
  bVar1 = x - 0x30;
  if (9 < bVar1) {
    bVar1 = 0;
  }
  return bVar1;
}

Assistant:

unsigned char DecimalFromHex(unsigned char x) {
    unsigned char y = '\0';
    if (x >= 'A' && x <= 'Z') y = x - 'A' + 10;
    else if (x >= 'a' && x <= 'z') y = x - 'a' + 10;
    else if (x >= '0' && x <= '9') y = x - '0';
    return y;
}